

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_td(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_ptr arg1;
  TCGv_i64 arg2;
  _Bool _Var1;
  uint32_t uVar2;
  TCGv_i32 arg4;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  _Var1 = check_unconditional_trap(ctx);
  if (!_Var1) {
    uVar2 = TO(ctx->opcode);
    arg4 = tcg_const_i32_ppc64(tcg_ctx_00,uVar2);
    arg1 = tcg_ctx_00->cpu_env;
    uVar2 = rA(ctx->opcode);
    arg2 = cpu_gpr[uVar2];
    uVar2 = rB(ctx->opcode);
    gen_helper_td(tcg_ctx_00,arg1,arg2,cpu_gpr[uVar2],arg4);
    tcg_temp_free_i32(tcg_ctx_00,arg4);
  }
  return;
}

Assistant:

static void gen_td(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;

    if (check_unconditional_trap(ctx)) {
        return;
    }
    t0 = tcg_const_i32(tcg_ctx, TO(ctx->opcode));
    gen_helper_td(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)],
                  t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}